

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::SourceCodeInfo_Location::SharedDtor(SourceCodeInfo_Location *this)

{
  internal::ArenaStringPtr::DestroyNoArena
            (&this->leading_comments_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  internal::ArenaStringPtr::DestroyNoArena
            (&this->trailing_comments_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  return;
}

Assistant:

void SourceCodeInfo_Location::SharedDtor() {
  leading_comments_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  trailing_comments_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
}